

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxCompareEq::Emit(FxCompareEq *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int opcode;
  
  uVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[7])();
  uVar8 = uVar3 >> 8;
  pFVar1 = (this->super_FxBinary).right;
  uVar4 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
  uVar5 = uVar4 >> 8;
  bVar2 = (byte)(uVar3 >> 8);
  if (bVar2 != (byte)(uVar4 >> 8)) {
    __assert_fail("op1.RegType == op2.RegType",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x6f7,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
  }
  if ((1 < bVar2) && ((uVar8 & 0xff) != 3)) {
    __assert_fail("op1.RegType == REGT_INT || op1.RegType == REGT_FLOAT || op1.RegType == REGT_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x6f8,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
  }
  uVar10 = uVar3 >> 0x10;
  uVar7 = uVar4 >> 0x10;
  if ((uVar10 & 1) == 0) {
    bVar2 = (byte)uVar3;
    uVar3 = uVar4;
    uVar4 = uVar5;
    uVar11 = uVar7;
    uVar7 = uVar10;
    uVar5 = uVar8;
  }
  else {
    bVar2 = (byte)uVar4;
    uVar4 = uVar8;
    uVar11 = uVar10;
  }
  if ((uVar7 & 1) == 0) {
    uVar8 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    bVar9 = (byte)uVar5;
    iVar6 = 0xb3;
    if (bVar9 == 1) {
      iVar6 = 0x97;
    }
    opcode = 0x73;
    if (bVar9 != 0) {
      opcode = iVar6;
    }
    if (((uVar7 & 2) == 0) && (bVar9 < 4)) {
      VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar5 & 0xff),(uint)bVar2,1);
    }
    if ((uVar11 & 1) == 0) {
      if (((uVar11 & 2) == 0) && ((byte)uVar4 < 4)) {
        VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar4 & 0xff),uVar3 & 0xff,1)
        ;
      }
    }
    else {
      opcode = opcode + 1;
    }
    uVar8 = uVar8 & 0xff;
    VMFunctionBuilder::Emit(build,1,uVar8,0,0);
    VMFunctionBuilder::Emit
              (build,opcode,
               (uint)(*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 != 0x11f),
               (uint)bVar2,uVar3 & 0xff);
    VMFunctionBuilder::Emit(build,0x37,1);
    VMFunctionBuilder::Emit(build,1,uVar8,1);
    return SUB43(uVar8,0);
  }
  __assert_fail("!op1.Konst",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x700,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxCompareEq::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	assert(op1.RegType == op2.RegType);
	assert(op1.RegType == REGT_INT || op1.RegType == REGT_FLOAT || op1.RegType == REGT_POINTER);
	int instr;

	// Only the second operand may be constant.
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);

	ExpEmit to(build, REGT_INT);

	instr = op1.RegType == REGT_INT ? OP_EQ_R :
			op1.RegType == REGT_FLOAT ? OP_EQF_R :
			OP_EQA_R;
	op1.Free(build);
	if (!op2.Konst)
	{
		op2.Free(build);
	}
	else
	{
		instr += 1;
	}

	// See FxUnaryNotBoolean for comments, since it's the same thing.
	build->Emit(OP_LI, to.RegNum, 0, 0);
	build->Emit(instr, Operator != TK_Eq, op1.RegNum, op2.RegNum);
	build->Emit(OP_JMP, 1);
	build->Emit(OP_LI, to.RegNum, 1);
	return to;
}